

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::java::ToJavaName
                   (string *__return_storage_ptr__,string *full_name,FileDescriptor *file)

{
  bool in_CL;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(char *)(*(long *)(file + 0xa0) + 0xa0) == '\x01') {
    FileJavaPackage_abi_cxx11_(&local_48,(java *)file,(FileDescriptor *)0x0,in_CL);
  }
  else {
    ClassName_abi_cxx11_(&local_48,(java *)file,file);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(full_name->_M_dataplus)._M_p);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)full_name);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ToJavaName(const string& full_name,
                  const FileDescriptor* file) {
  string result;
  if (file->options().java_multiple_files()) {
    result = FileJavaPackage(file);
  } else {
    result = ClassName(file);
  }
  if (!result.empty()) {
    result += '.';
  }
  if (file->package().empty()) {
    result += full_name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the Java package.
    result += full_name.substr(file->package().size() + 1);
  }
  return result;
}